

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

bool __thiscall DropdownMenu::update(DropdownMenu *this,int mouseX,int mouseY,bool clicked)

{
  Transformable *this_00;
  pointer pTVar1;
  bool bVar2;
  int iVar3;
  Vector2f *pVVar4;
  uint uVar5;
  uint mouseX_00;
  TextButton *b;
  pointer pTVar6;
  byte bVar7;
  uint mouseY_00;
  
  uVar5 = (uint)clicked;
  this_00 = &(this->super_UIComponent).super_Transformable;
  pVVar4 = sf::Transformable::getPosition(this_00);
  mouseX_00 = mouseX - (int)pVVar4->x;
  pVVar4 = sf::Transformable::getPosition(this_00);
  mouseY_00 = mouseY - (int)pVVar4->y;
  if ((this->super_UIComponent).super_Transformable.field_0xa9 == '\x01') {
    pTVar1 = (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl
             .super__Vector_impl_data._M_finish;
    bVar7 = 0;
    for (pTVar6 = (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>.
                  _M_impl.super__Vector_impl_data._M_start; pTVar6 != pTVar1; pTVar6 = pTVar6 + 1) {
      iVar3 = (*(pTVar6->super_UIComponent).super_Drawable._vptr_Drawable[3])
                        (pTVar6,(ulong)mouseX_00,(ulong)mouseY_00,(ulong)(uVar5 & 1));
      if ((pTVar6->selected & bVar7) == 1) {
        sf::Shape::setFillColor(&(pTVar6->button).super_Shape,&pTVar6->color1);
        pTVar6->selected = false;
        bVar7 = 1;
      }
      else {
        bVar7 = bVar7 | pTVar6->selected;
      }
      uVar5 = (uint)(byte)((byte)uVar5 & ((byte)iVar3 ^ 1));
    }
  }
  bVar2 = TextButton::update(&this->button,mouseX_00,mouseY_00,clicked);
  if (bVar2) {
    bVar7 = (this->super_UIComponent).super_Transformable.field_0xa9 ^ 1;
  }
  else {
    if (!clicked) {
      return false;
    }
    bVar7 = 0;
  }
  (this->super_UIComponent).super_Transformable.field_0xa9 = bVar7;
  return false;
}

Assistant:

bool DropdownMenu::update(int mouseX, int mouseY, bool clicked) {
    mouseX -= static_cast<int>(getPosition().x);
    mouseY -= static_cast<int>(getPosition().y);
    if (visible) {
        bool clickDone = clicked, buttonSelected = false;
        for (TextButton& b : menuButtons) {
            if (b.update(mouseX, mouseY, clickDone)) {    // Only one button in the menu can be pressed.
                clickDone = false;
            }
            if (b.selected && !buttonSelected) {
                buttonSelected = true;
            } else if (b.selected) {
                b.button.setFillColor(b.color1);
                b.selected = false;
            }
        }
    }
    if (button.update(mouseX, mouseY, clicked)) {
        visible = !visible;
    } else if (clicked) {
        visible = false;
    }
    return false;
}